

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

DriveStrengthSyntax * __thiscall slang::parsing::Parser::parseDriveStrength(Parser *this)

{
  Token comma;
  bool bVar1;
  bool bVar2;
  SourceLocation SVar3;
  Diagnostic *this_00;
  DriveStrengthSyntax *pDVar4;
  DiagCode code;
  Token openParen;
  Token TVar5;
  Token closeParen;
  SourceRange SVar6;
  Token strength1;
  Token strength0;
  Token local_88;
  Token local_78;
  undefined8 local_68;
  Info *local_60;
  undefined8 local_58;
  Token local_50;
  undefined8 local_40;
  Info *pIStack_38;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar1) {
    TVar5 = ParserBase::consume(&this->super_ParserBase);
    local_60 = TVar5.info;
    local_58 = TVar5._0_8_;
    local_88 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isDriveStrength(local_88.kind);
    if (bVar1) {
      local_78 = ParserBase::consume(&this->super_ParserBase);
    }
    else {
      SVar3 = Token::location(&local_88);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x470005,SVar3);
      SVar3 = Token::location(&local_88);
      local_78 = ParserBase::missingToken(&this->super_ParserBase,Strong1Keyword,SVar3);
    }
    TVar5 = ParserBase::expect(&this->super_ParserBase,Comma);
    local_68 = TVar5._0_8_;
    local_88 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isDriveStrength(local_88.kind);
    if (bVar1) {
      local_88 = ParserBase::consume(&this->super_ParserBase);
    }
    else {
      SVar3 = Token::location(&local_88);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x470005,SVar3);
      SVar3 = Token::location(&local_88);
      local_88 = ParserBase::missingToken(&this->super_ParserBase,Strong0Keyword,SVar3);
    }
    closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    bVar1 = slang::syntax::SyntaxFacts::isStrength0(local_78.kind);
    bVar2 = slang::syntax::SyntaxFacts::isStrength0(local_88.kind);
    code.subsystem = Parser;
    code.code = 0x23;
    if ((bVar1 == bVar2) ||
       (((local_78._0_4_ & 0xfffe) == 0xb4 &&
        (code.subsystem = Parser, code.code = 0x22, (local_88._0_4_ & 0xfffe) == 0xb4)))) {
      SVar6 = Token::range(&local_88);
      this_00 = ParserBase::addDiag(&this->super_ParserBase,code,SVar6);
      SVar6 = Token::range(&local_78);
      Diagnostic::operator<<(this_00,SVar6);
    }
    local_40 = local_68;
    comma.info = TVar5.info;
    comma.kind = (undefined2)local_68;
    comma._2_1_ = local_68._2_1_;
    comma.numFlags.raw = local_68._3_1_;
    comma.rawLen = local_68._4_4_;
    openParen.info = local_60;
    openParen.kind = (undefined2)local_58;
    openParen._2_1_ = local_58._2_1_;
    openParen.numFlags.raw = local_58._3_1_;
    openParen.rawLen = local_58._4_4_;
    local_50 = closeParen;
    pIStack_38 = TVar5.info;
    pDVar4 = slang::syntax::SyntaxFactory::driveStrength
                       (&this->factory,openParen,local_78,comma,local_88,closeParen);
  }
  else {
    pDVar4 = (DriveStrengthSyntax *)0x0;
  }
  return pDVar4;
}

Assistant:

DriveStrengthSyntax* Parser::parseDriveStrength() {
    if (!peek(TokenKind::OpenParenthesis))
        return nullptr;

    auto expectStrength = [&](TokenKind defaultKind) {
        Token next = peek();
        if (isDriveStrength(next.kind))
            return consume();

        addDiag(diag::ExpectedNetStrength, next.location());
        return missingToken(defaultKind, next.location());
    };

    auto openParen = consume();
    auto strength0 = expectStrength(TokenKind::Strong1Keyword);
    auto comma = expect(TokenKind::Comma);
    auto strength1 = expectStrength(TokenKind::Strong0Keyword);
    auto closeParen = expect(TokenKind::CloseParenthesis);

    if (isStrength0(strength0.kind) == isStrength0(strength1.kind))
        addDiag(diag::DriveStrengthInvalid, strength1.range()) << strength0.range();
    else if (isHighZ(strength0) && isHighZ(strength1))
        addDiag(diag::DriveStrengthHighZ, strength1.range()) << strength0.range();

    return &factory.driveStrength(openParen, strength0, comma, strength1, closeParen);
}